

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O3

void convertARGBToRGBA64PM_sse4<true>(QRgba64 *buffer,uint *src,int count)

{
  long lVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  QRgba64 QVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  QRgba64 local_40;
  long local_38;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  auVar3 = _DAT_006a23c0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  if (3 < count) {
    uVar4 = 0;
    do {
      auVar16 = *(undefined1 (*) [16])(src + uVar4);
      if ((auVar3 & auVar16) == (undefined1  [16])0x0) {
        buffer[uVar4].rgba = 0;
        (buffer + uVar4)[1].rgba = 0;
        buffer[uVar4 + 2].rgba = 0;
        (buffer + uVar4 + 2)[1].rgba = 0;
      }
      else {
        auVar17._0_14_ = auVar16._0_14_;
        auVar17[0xe] = auVar16[7];
        auVar17[0xf] = auVar16[7];
        auVar15._14_2_ = auVar17._14_2_;
        auVar15._0_13_ = auVar16._0_13_;
        auVar15[0xd] = auVar16[6];
        auVar14._13_3_ = auVar15._13_3_;
        auVar14._0_12_ = auVar16._0_12_;
        auVar14[0xc] = auVar16[6];
        auVar13._12_4_ = auVar14._12_4_;
        auVar13._0_11_ = auVar16._0_11_;
        auVar13[0xb] = auVar16[5];
        auVar12._11_5_ = auVar13._11_5_;
        auVar12._0_10_ = auVar16._0_10_;
        auVar12[10] = auVar16[5];
        auVar11._10_6_ = auVar12._10_6_;
        auVar11._0_9_ = auVar16._0_9_;
        auVar11[9] = auVar16[4];
        auVar10._9_7_ = auVar11._9_7_;
        auVar10._0_8_ = auVar16._0_8_;
        auVar10[8] = auVar16[4];
        auVar9._8_8_ = auVar10._8_8_;
        auVar9[7] = auVar16[3];
        auVar9[6] = auVar16[3];
        auVar9[5] = auVar16[2];
        auVar9[4] = auVar16[2];
        auVar9[3] = auVar16[1];
        auVar9[2] = auVar16[1];
        auVar9[1] = auVar16[0];
        auVar9[0] = auVar16[0];
        auVar8[1] = auVar16[8];
        auVar8[0] = auVar16[8];
        auVar8[2] = auVar16[9];
        auVar8[3] = auVar16[9];
        auVar8[4] = auVar16[10];
        auVar8[5] = auVar16[10];
        auVar8[6] = auVar16[0xb];
        auVar8[7] = auVar16[0xb];
        auVar8[8] = auVar16[0xc];
        auVar8[9] = auVar16[0xc];
        auVar8[10] = auVar16[0xd];
        auVar8[0xb] = auVar16[0xd];
        auVar8[0xc] = auVar16[0xe];
        auVar8[0xd] = auVar16[0xe];
        auVar8[0xf] = auVar16[0xf];
        auVar8[0xe] = auVar8[0xf];
        if ((auVar3 & ~auVar16) == (undefined1  [16])0x0) {
          *(undefined1 (*) [16])(buffer + uVar4) = auVar9;
          *(undefined1 (*) [16])(buffer + uVar4 + 2) = auVar8;
        }
        else {
          auVar16 = pshuflw(in_XMM4,auVar9,0xff);
          auVar16 = pshufhw(auVar16,auVar16,0xff);
          auVar16 = pmulhuw(auVar16,auVar9);
          auVar17 = pshuflw(in_XMM5,auVar8,0xff);
          auVar17 = pshufhw(auVar17,auVar17,0xff);
          in_XMM5 = pmulhuw(auVar17,auVar8);
          auVar18._0_2_ = auVar16._0_2_ - (auVar16._0_2_ >> 0xf);
          auVar18._2_2_ = auVar16._2_2_ - (auVar16._2_2_ >> 0xf);
          auVar18._4_2_ = auVar16._4_2_ - (auVar16._4_2_ >> 0xf);
          auVar18._6_2_ = auVar16._6_2_ - (auVar16._6_2_ >> 0xf);
          auVar18._8_2_ = auVar16._8_2_ - (auVar16._8_2_ >> 0xf);
          auVar18._10_2_ = auVar16._10_2_ - (auVar16._10_2_ >> 0xf);
          auVar18._12_2_ = auVar16._12_2_ - (auVar16._12_2_ >> 0xf);
          auVar18._14_2_ = auVar16._14_2_ - (auVar16._14_2_ >> 0xf);
          auVar16._0_2_ = in_XMM5._0_2_ - (in_XMM5._0_2_ >> 0xf);
          auVar16._2_2_ = in_XMM5._2_2_ - (in_XMM5._2_2_ >> 0xf);
          auVar16._4_2_ = in_XMM5._4_2_ - (in_XMM5._4_2_ >> 0xf);
          auVar16._6_2_ = in_XMM5._6_2_ - (in_XMM5._6_2_ >> 0xf);
          auVar16._8_2_ = in_XMM5._8_2_ - (in_XMM5._8_2_ >> 0xf);
          auVar16._10_2_ = in_XMM5._10_2_ - (in_XMM5._10_2_ >> 0xf);
          auVar16._12_2_ = in_XMM5._12_2_ - (in_XMM5._12_2_ >> 0xf);
          auVar16._14_2_ = in_XMM5._14_2_ - (in_XMM5._14_2_ >> 0xf);
          auVar17 = pblendw(auVar18,auVar9,0x88);
          in_XMM4 = pblendw(auVar16,auVar8,0x88);
          *(undefined1 (*) [16])(buffer + uVar4) = auVar17;
          *(undefined1 (*) [16])(buffer + uVar4 + 2) = in_XMM4;
        }
      }
      uVar4 = uVar4 + 4;
    } while (uVar4 < count - 3);
  }
  if ((int)uVar4 < count) {
    uVar4 = uVar4 & 0xffffffff;
    lVar6 = 0;
    do {
      uVar2 = src[uVar4 + lVar6];
      uVar7 = (ulong)(uVar2 >> 0x18) << 0x30 |
              CONCAT44(uVar2 >> 0x10,(uVar2 & 0xff00) << 8 | uVar2 & 0xff) & 0xffffffffff;
      local_40.rgba = uVar7 << 8 | uVar7;
      QVar5 = QRgba64::premultiplied(&local_40);
      buffer[uVar4 + lVar6].rgba = QVar5.rgba;
      if (1 < (uint)lVar6) break;
      lVar1 = uVar4 + 1 + lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar1 < count);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void convertARGBToRGBA64PM_sse4(QRgba64 *buffer, const uint *src, int count)
{
    int i = 0;
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i rgbaMask = _mm_setr_epi8(2, 1, 0, 3, 6, 5, 4, 7, 10, 9, 8, 11, 14, 13, 12, 15);
    const __m128i shuffleMask = _mm_setr_epi8(6, 7, 6, 7, 6, 7, 6, 7, 14, 15, 14, 15, 14, 15, 14, 15);
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[i]);
        if (!_mm_testz_si128(srcVector, alphaMask)) {
            bool cf = _mm_testc_si128(srcVector, alphaMask);

            if (!RGBA)
                srcVector = _mm_shuffle_epi8(srcVector, rgbaMask);
            const __m128i src1 = _mm_unpacklo_epi8(srcVector, srcVector);
            const __m128i src2 = _mm_unpackhi_epi8(srcVector, srcVector);
            if (!cf) {
                __m128i alpha1 = _mm_shuffle_epi8(src1, shuffleMask);
                __m128i alpha2 = _mm_shuffle_epi8(src2, shuffleMask);
                __m128i dst1 = _mm_mulhi_epu16(src1, alpha1);
                __m128i dst2 = _mm_mulhi_epu16(src2, alpha2);
                // Map 0->0xfffe to 0->0xffff
                dst1 = _mm_add_epi16(dst1, _mm_srli_epi16(dst1, 15));
                dst2 = _mm_add_epi16(dst2, _mm_srli_epi16(dst2, 15));
                // correct alpha value:
                dst1 = _mm_blend_epi16(dst1, src1, 0x88);
                dst2 = _mm_blend_epi16(dst2, src2, 0x88);
                _mm_storeu_si128((__m128i *)&buffer[i], dst1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], dst2);
            } else {
                _mm_storeu_si128((__m128i *)&buffer[i], src1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], src2);
            }
        } else {
            _mm_storeu_si128((__m128i *)&buffer[i], zero);
            _mm_storeu_si128((__m128i *)&buffer[i + 2], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        const uint s = RGBA ? RGBA2ARGB(src[i]) : src[i];
        buffer[i] = QRgba64::fromArgb32(s).premultiplied();
    }
}